

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchronization.cc
# Opt level: O2

void __thiscall
tchecker::system::synchronization_t::add_synchronization_constraint
          (synchronization_t *this,sync_constraint_t *constr)

{
  process_id_t *ppVar1;
  invalid_argument *this_00;
  pointer psVar2;
  
  psVar2 = (this->_constraints).
           super__Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (psVar2 == (this->_constraints).
                  super__Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
      ::push_back(&this->_constraints,constr);
      return;
    }
    ppVar1 = &psVar2->_pid;
    psVar2 = psVar2 + 1;
  } while (*ppVar1 != constr->_pid);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"process is already synchronized");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void synchronization_t::add_synchronization_constraint(tchecker::system::sync_constraint_t const & constr)
{
  // Check that process is not synchronized yet
  for (tchecker::system::sync_constraint_t const & c : _constraints)
    if (c.pid() == constr.pid())
      throw std::invalid_argument("process is already synchronized");
  _constraints.push_back(constr);
}